

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::Subject::Subject(Subject *this,string *formatted_string)

{
  Subject local_30;
  string *local_18;
  string *formatted_string_local;
  Subject *this_local;
  
  local_18 = formatted_string;
  formatted_string_local = (string *)this;
  SubjectUtils::CreateSubjectFromString(&local_30,formatted_string);
  Subject(this,&local_30);
  ~Subject(&local_30);
  return;
}

Assistant:

Subject::Subject(const std::string& formatted_string) : Subject(SubjectUtils::CreateSubjectFromString(formatted_string))
{
}